

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void hmac_apply_key(st_picotls_hmac_context_t *ctx,uint8_t pad)

{
  byte in_SIL;
  long in_RDI;
  size_t i;
  undefined8 local_18;
  
  for (local_18 = 0; local_18 != **(long **)(in_RDI + 0x18); local_18 = local_18 + 1) {
    *(byte *)(in_RDI + 0x28 + local_18) = *(byte *)(in_RDI + 0x28 + local_18) ^ in_SIL;
  }
  (*(code *)**(undefined8 **)(in_RDI + 0x20))
            (*(undefined8 *)(in_RDI + 0x20),in_RDI + 0x28,**(undefined8 **)(in_RDI + 0x18));
  for (local_18 = 0; local_18 != **(long **)(in_RDI + 0x18); local_18 = local_18 + 1) {
    *(byte *)(in_RDI + 0x28 + local_18) = *(byte *)(in_RDI + 0x28 + local_18) ^ in_SIL;
  }
  return;
}

Assistant:

static void hmac_apply_key(struct st_picotls_hmac_context_t *ctx, uint8_t pad)
{
    size_t i;

    for (i = 0; i != ctx->algo->block_size; ++i)
        ctx->key[i] ^= pad;
    ctx->hash->update(ctx->hash, ctx->key, ctx->algo->block_size);
    for (i = 0; i != ctx->algo->block_size; ++i)
        ctx->key[i] ^= pad;
}